

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O2

bool WScriptJsrt::Uninitialize(void)

{
  long lVar1;
  code *pcVar2;
  size_t sVar3;
  DWORD DVar4;
  RuntimeThreadLocalData *pRVar5;
  PAL_FILE *pPVar6;
  RuntimeThreadData *pRVar7;
  _List_node_base *p_Var8;
  undefined1 auStack_48 [8];
  vector<void_*,_std::allocator<void_*>_> childrenHandles;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
  ::clear(&moduleRecordMap_abi_cxx11_._M_t);
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&moduleDirMap_abi_cxx11_._M_t);
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_ModuleState>,_std::_Select1st<std::pair<void_*const,_ModuleState>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
  ::clear(&moduleErrMap._M_t);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&scriptDirMap_abi_cxx11_._M_t);
  pRVar5 = GetRuntimeThreadLocalData();
  pRVar7 = pRVar5->threadData;
  if ((pRVar7 != (RuntimeThreadData *)0x0) &&
     (p_Var8 = (_List_node_base *)&pRVar7->children,
     (pRVar7->children).super__List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>.
     _M_impl._M_node.super__List_node_base._M_next != p_Var8)) {
    sVar3 = (pRVar7->children).
            super__List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>._M_impl.
            _M_node._M_size;
    auStack_48 = (undefined1  [8])0x0;
    childrenHandles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    childrenHandles.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    while (p_Var8 = (((_List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_> *)
                     &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var8 != (_List_node_base *)&pRVar5->threadData->children) {
      lVar1 = (long)p_Var8[1]._M_next;
      std::vector<void_*,_std::allocator<void_*>_>::push_back
                ((vector<void_*,_std::allocator<void_*>_> *)auStack_48,(value_type *)(lVar1 + 0x20))
      ;
      SetEvent(*(HANDLE *)(lVar1 + 0x10));
    }
    DVar4 = WaitForMultipleObjects((DWORD)sVar3,(HANDLE *)auStack_48,1,0xffffffff);
    if (DVar4 != 0) {
      pPVar6 = PAL_get_stderr(0);
      PAL_fprintf(pPVar6,"ASSERTION (%s, line %d) %s %s\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/WScriptJsrt.cpp"
                  ,0x4fd,"waitRet == 0","waitRet == WAIT_OBJECT_0");
      pPVar6 = PAL_get_stderr(0);
      PAL_fflush(pPVar6);
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    pRVar7 = pRVar5->threadData;
    p_Var8 = (_List_node_base *)&pRVar7->children;
    while( true ) {
      p_Var8 = (((_List_base<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_> *)
                &p_Var8->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      if (p_Var8 == (_List_node_base *)&pRVar7->children) break;
      pRVar7 = (RuntimeThreadData *)p_Var8[1]._M_next;
      if (pRVar7 != (RuntimeThreadData *)0x0) {
        RuntimeThreadData::~RuntimeThreadData(pRVar7);
      }
      operator_delete(pRVar7);
      pRVar7 = pRVar5->threadData;
    }
    std::__cxx11::list<RuntimeThreadData_*,_std::allocator<RuntimeThreadData_*>_>::clear
              (&pRVar7->children);
    std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
              ((_Vector_base<void_*,_std::allocator<void_*>_> *)auStack_48);
  }
  return true;
}

Assistant:

bool WScriptJsrt::Uninitialize()
{
    // moduleRecordMap is a global std::map, its destructor may access overridden
    // "operator delete" / global HeapAllocator::Instance. Clear it manually here
    // to avoid worrying about global destructor order.
    moduleRecordMap.clear();
    moduleDirMap.clear();
    moduleErrMap.clear();
    scriptDirMap.clear();

    auto& threadData = GetRuntimeThreadLocalData().threadData;
    if (threadData && !threadData->children.empty())
    {
        LONG count = (LONG)threadData->children.size();
        std::vector<HANDLE> childrenHandles;

        //Clang does not support "for each" yet
        for(auto i = threadData->children.begin(); i!= threadData->children.end(); i++)
        {
            auto child = *i;
            childrenHandles.push_back(child->hThread);
            SetEvent(child->hevntShutdown);
        }

        DWORD waitRet = WaitForMultipleObjects(count, &childrenHandles[0], TRUE, INFINITE);
        Assert(waitRet == WAIT_OBJECT_0);

        for (auto i = threadData->children.begin(); i != threadData->children.end(); i++)
        {
            delete *i;
        }

        threadData->children.clear();
    }

    return true;
}